

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

MPP_RET h264e_vepu_mbrc_update(HalH264eVepuMbRcCtx ctx,HalH264eVepuMbRc *mbrc)

{
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_mbrc_update");
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_mbrc_update");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_mbrc_update(HalH264eVepuMbRcCtx ctx, HalH264eVepuMbRc *mbrc)
{
    HalH264eVepuMbRcImpl *p = (HalH264eVepuMbRcImpl *)ctx;
    (void) p;
    (void) mbrc;

    hal_h264e_dbg_func("enter\n");
    hal_h264e_dbg_func("leave\n");
    return MPP_OK;
}